

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_absolute.cxx
# Opt level: O0

int fl_filename_relative(char *to,int tolen,char *from)

{
  char *pcVar1;
  char local_828 [8];
  char cwd_buf [2048];
  char *from_local;
  int tolen_local;
  char *to_local;
  
  cwd_buf._2040_8_ = from;
  pcVar1 = fl_getcwd(local_828,0x800);
  if (pcVar1 == (char *)0x0) {
    fl_strlcpy(to,(char *)cwd_buf._2040_8_,(long)tolen);
    to_local._4_4_ = 0;
  }
  else {
    to_local._4_4_ = fl_filename_relative(to,tolen,(char *)cwd_buf._2040_8_,local_828);
  }
  return to_local._4_4_;
}

Assistant:

int					// O - 0 if no change, 1 if changed
fl_filename_relative(char       *to,	// O - Relative filename
                     int        tolen,	// I - Size of "to" buffer
                     const char *from)  // I - Absolute filename
{
  char cwd_buf[FL_PATH_MAX];	// Current directory
  // get the current directory and return if we can't
  if (!fl_getcwd(cwd_buf, sizeof(cwd_buf))) {
    strlcpy(to, from, tolen);
    return 0;
  }
  return fl_filename_relative(to, tolen, from, cwd_buf);
}